

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classmetadata.cpp
# Opt level: O3

FunctionDefinition * __thiscall
stackjit::ClassMetadata::getVirtualFunctionRootDefinition
          (ClassMetadata *this,FunctionDefinition *funcDef)

{
  pointer ppFVar1;
  FunctionDefinition *this_00;
  size_t __n;
  bool bVar2;
  int iVar3;
  ClassMetadata *pCVar4;
  string *psVar5;
  string *psVar6;
  vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_> *list1;
  vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_> *list2;
  ClassType **ppCVar7;
  ClassType *this_01;
  pointer ppFVar8;
  
  this_01 = this->mParentClass;
  if (this_01 == (ClassType *)0x0) {
    return funcDef;
  }
  ppCVar7 = &this->mParentClass;
LAB_001712cc:
  pCVar4 = ClassType::metadata(this_01);
  ppFVar8 = (pCVar4->mVirtualFunctions).
            super__Vector_base<const_stackjit::FunctionDefinition_*,_std::allocator<const_stackjit::FunctionDefinition_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppFVar1 = (pCVar4->mVirtualFunctions).
            super__Vector_base<const_stackjit::FunctionDefinition_*,_std::allocator<const_stackjit::FunctionDefinition_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppFVar8 == ppFVar1) {
      return funcDef;
    }
    this_00 = *ppFVar8;
    psVar5 = FunctionDefinition::memberName_abi_cxx11_(funcDef);
    psVar6 = FunctionDefinition::memberName_abi_cxx11_(this_00);
    __n = psVar5->_M_string_length;
    if ((__n == psVar6->_M_string_length) &&
       ((__n == 0 ||
        (iVar3 = bcmp((psVar5->_M_dataplus)._M_p,(psVar6->_M_dataplus)._M_p,__n), iVar3 == 0)))) {
      list1 = FunctionDefinition::callParameters(funcDef);
      list2 = FunctionDefinition::callParameters(this_00);
      bVar2 = TypeSystem::areEqual(list1,list2);
      if (bVar2) break;
    }
    ppFVar8 = ppFVar8 + 1;
  } while( true );
  pCVar4 = ClassType::metadata(*ppCVar7);
  this_01 = pCVar4->mParentClass;
  ppCVar7 = &pCVar4->mParentClass;
  funcDef = this_00;
  if (this_01 == (ClassType *)0x0) {
    return this_00;
  }
  goto LAB_001712cc;
}

Assistant:

const FunctionDefinition* ClassMetadata::getVirtualFunctionRootDefinition(const FunctionDefinition* funcDef) const {
		if (mParentClass != nullptr) {
			for (auto parentDef : mParentClass->metadata()->mVirtualFunctions) {
				if (funcDef->memberName() == parentDef->memberName()
					&& TypeSystem::areEqual(funcDef->callParameters(), parentDef->callParameters())) {
					return mParentClass->metadata()->getVirtualFunctionRootDefinition(parentDef);
				}
			}
		}

		return funcDef;
	}